

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infer.cpp
# Opt level: O3

tensor_t<float> * loadImageAsTensor(tensor_t<float> *__return_storage_ptr__,string *file_name)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  runtime_error *this;
  byte *pbVar6;
  byte *pbVar7;
  int i;
  long lVar8;
  int j;
  long lVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  readFile(&local_48,file_name);
  pbVar7 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar4 = *(int *)pbVar7;
      pbVar7 = pbVar7 + 1;
    } while (iVar4 != 0xa353532);
    tensor_t<float>::tensor_t(__return_storage_ptr__,0x1c,0x1c,1);
    lVar8 = 0;
    do {
      lVar9 = 0;
      pbVar6 = pbVar7;
      do {
        bVar1 = pbVar6[-1];
        bVar2 = *pbVar6;
        bVar3 = pbVar6[1];
        pfVar5 = tensor_t<float>::get(__return_storage_ptr__,(int)lVar9,(int)lVar8,0);
        *pfVar5 = ((float)bVar2 + (float)bVar1 + (float)bVar3) * 0.0013071896;
        lVar9 = lVar9 + 1;
        pbVar6 = pbVar6 + 3;
      } while (lVar9 != 0x1c);
      lVar8 = lVar8 + 1;
      pbVar7 = pbVar7 + 0x54;
    } while (lVar8 != 0x1c);
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Could not open image.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tensor_t<float> loadImageAsTensor(const std::string &file_name) {
  // Read the test image for inference
  auto data = readFile(file_name);

  // If the image was loaded
  if (!data.empty()) {

    // Iterate over the image data until we find the actual pixel
    uint8_t *usable = data.data();
    while (*(uint32_t *) usable != 0x0A353532)
      usable++;

#pragma pack(push, 1)
    struct RGB {
      uint8_t r, g, b;
    };
#pragma pack(pop)

    RGB *rgb = (RGB *) usable;

    // Pre-processing for the test image
    tensor_t<float> image(28, 28, 1);
    for (int i = 0; i < 28; i++) {
      for (int j = 0; j < 28; j++) {
        RGB rgb_ij = rgb[i * 28 + j];
        image(j, i, 0) = (((float) rgb_ij.r
            + rgb_ij.g
            + rgb_ij.b)
            / (3.0f * 255.f));
      }
    }
    return image;
  } else {
    throw std::runtime_error("Could not open image.");
  }
}